

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_stderr.c
# Opt level: O1

void tool_set_stderr_file(GlobalConfig *global,char *filename)

{
  int iVar1;
  FILE *pFVar2;
  FILE *pFVar3;
  
  pFVar2 = (FILE *)tool_stderr;
  if ((filename != (char *)0x0) &&
     (iVar1 = strcmp(filename,"-"), pFVar2 = (FILE *)_stdout, iVar1 != 0)) {
    pFVar2 = fopen64(filename,"w");
    if (pFVar2 == (FILE *)0x0) {
      warnf(global,"Warning: Failed to open %s",filename);
      return;
    }
    fclose(pFVar2);
    pFVar3 = freopen64(filename,"w",_stderr);
    pFVar2 = _stderr;
    if (pFVar3 == (FILE *)0x0) {
      return;
    }
  }
  tool_stderr = (FILE *)pFVar2;
  return;
}

Assistant:

void tool_set_stderr_file(struct GlobalConfig *global, const char *filename)
{
  FILE *fp;

  if(!filename)
    return;

  if(!strcmp(filename, "-")) {
    tool_stderr = stdout;
    return;
  }

  /* precheck that filename is accessible to lessen the chance that the
     subsequent freopen will fail. */
  fp = fopen(filename, FOPEN_WRITETEXT);
  if(!fp) {
    warnf(global, "Warning: Failed to open %s", filename);
    return;
  }
  fclose(fp);

  /* freopen the actual stderr (stdio.h stderr) instead of tool_stderr since
     the latter may be set to stdout. */
  /* !checksrc! disable STDERR 1 */
  fp = freopen(filename, FOPEN_WRITETEXT, stderr);
  if(!fp) {
    /* stderr may have been closed by freopen. there is nothing to be done. */
    DEBUGASSERT(0);
    return;
  }
  /* !checksrc! disable STDERR 1 */
  tool_stderr = stderr;
}